

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

void __thiscall
ApprovalTests::Options::Options
          (Options *this,FileOptions *fileOptions,Scrubber *scrubber,Reporter *reporter,
          bool usingDefaultScrubber,shared_ptr<ApprovalTests::ApprovalNamer> *namer)

{
  FileOptions::FileOptions(&this->fileOptions_,fileOptions);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->scrubber_,scrubber);
  this->reporter_ = reporter;
  ::std::__shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->namer_).
              super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>,
             &namer->super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>);
  this->usingDefaultScrubber_ = usingDefaultScrubber;
  return;
}

Assistant:

Options::Options(Options::FileOptions fileOptions,
                     Scrubber scrubber,
                     const Reporter& reporter,
                     bool usingDefaultScrubber,
                     std::shared_ptr<ApprovalNamer> namer)
        : fileOptions_(std::move(fileOptions))
        , scrubber_(std::move(scrubber))
        , reporter_(reporter)
        , namer_(namer)
        , usingDefaultScrubber_(usingDefaultScrubber)
    {
    }